

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O0

Surface * __thiscall Assimp::LWO::Surface::operator=(Surface *this,Surface *param_1)

{
  undefined3 uVar1;
  float fVar2;
  Surface *param_1_local;
  Surface *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)param_1);
  aiColor3D::operator=(&this->mColor,&param_1->mColor);
  uVar1 = *(undefined3 *)&param_1->field_0x2d;
  fVar2 = param_1->mDiffuseValue;
  this->bDoubleSided = param_1->bDoubleSided;
  *(undefined3 *)&this->field_0x2d = uVar1;
  this->mDiffuseValue = fVar2;
  fVar2 = param_1->mTransparency;
  this->mSpecularValue = param_1->mSpecularValue;
  this->mTransparency = fVar2;
  fVar2 = param_1->mLuminosity;
  this->mGlossiness = param_1->mGlossiness;
  this->mLuminosity = fVar2;
  fVar2 = param_1->mMaximumSmoothAngle;
  this->mColorHighlights = param_1->mColorHighlights;
  this->mMaximumSmoothAngle = fVar2;
  std::__cxx11::string::operator=((string *)&this->mVCMap,(string *)&param_1->mVCMap);
  this->mVCMapType = param_1->mVCMapType;
  std::__cxx11::list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::operator=
            (&this->mShaders,&param_1->mShaders);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::operator=
            (&this->mColorTextures,&param_1->mColorTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::operator=
            (&this->mDiffuseTextures,&param_1->mDiffuseTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::operator=
            (&this->mSpecularTextures,&param_1->mSpecularTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::operator=
            (&this->mOpacityTextures,&param_1->mOpacityTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::operator=
            (&this->mBumpTextures,&param_1->mBumpTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::operator=
            (&this->mGlossinessTextures,&param_1->mGlossinessTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::operator=
            (&this->mReflectionTextures,&param_1->mReflectionTextures);
  fVar2 = param_1->mBumpIntensity;
  this->mIOR = param_1->mIOR;
  this->mBumpIntensity = fVar2;
  uVar1 = *(undefined3 *)&param_1->field_0x141;
  fVar2 = param_1->mAdditiveTransparency;
  this->mWireframe = param_1->mWireframe;
  *(undefined3 *)&this->field_0x141 = uVar1;
  this->mAdditiveTransparency = fVar2;
  return this;
}

Assistant:

Surface()
        : mColor                (0.78431f,0.78431f,0.78431f)
        , bDoubleSided          (false)
        , mDiffuseValue         (1.f)
        , mSpecularValue        (0.f)
        , mTransparency         (0.f)
        , mGlossiness           (0.4f)
        , mLuminosity           (0.f)
        , mColorHighlights      (0.f)
        , mMaximumSmoothAngle   (0.f) // 0 == not specified, no smoothing
        , mVCMap                ("")
        , mVCMapType            (AI_LWO_RGBA)
        , mIOR                  (1.f) // vakuum
        , mBumpIntensity        (1.f)
        , mWireframe            (false)
        , mAdditiveTransparency (0.f)
    {}